

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O0

void duckdb::TimeToStringCast::Format
               (char *data,idx_t length,int32_t hour,int32_t minute,int32_t second,
               int32_t microsecond,char *micro_buffer)

{
  ulong in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int32_t in_stack_ffffffffffffffdc;
  
  FormatTwoDigits((char *)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffdc);
  *(undefined1 *)(in_RDI + 2) = 0x3a;
  FormatTwoDigits((char *)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffdc);
  *(undefined1 *)(in_RDI + 5) = 0x3a;
  FormatTwoDigits((char *)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffdc);
  if (8 < in_RSI) {
    *(undefined1 *)(in_RDI + 8) = 0x2e;
    memcpy((void *)(in_RDI + 9),(void *)CONCAT44(second,microsecond),in_RSI - 9);
  }
  return;
}

Assistant:

static void Format(char *data, idx_t length, int32_t hour, int32_t minute, int32_t second, int32_t microsecond,
	                   char micro_buffer[]) {
		// first write hour, month and day
		FormatTwoDigits(data, hour);
		data[2] = ':';
		FormatTwoDigits(data + 3, minute);
		data[5] = ':';
		FormatTwoDigits(data + 6, second);
		if (length > 8) {
			// write the micro seconds at the end
			data[8] = '.';
			memcpy(data + 9, micro_buffer, length - 9);
		}
	}